

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  AssertionResult *in_stack_00000008;
  Colour colour;
  undefined8 in_stack_ffffffffffffffa8;
  Code _colourCode;
  AssertionResult *this_00;
  Colour *in_stack_ffffffffffffffb0;
  string *psVar2;
  string local_40 [64];
  
  _colourCode = (Code)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  bVar1 = AssertionResult::hasExpandedExpression(in_stack_00000008);
  if (bVar1) {
    dimColour();
    Colour::Colour(in_stack_ffffffffffffffb0,_colourCode);
    std::operator<<((ostream *)*in_RDI," for: ");
    Colour::~Colour((Colour *)0x1fb896);
    this_00 = (AssertionResult *)*in_RDI;
    psVar2 = local_40;
    AssertionResult::getExpandedExpression_abi_cxx11_(this_00);
    std::operator<<((ostream *)this_00,psVar2);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    {
                        Colour colour( dimColour() );
                        stream << " for: ";
                    }
                    stream << result.getExpandedExpression();
                }
            }